

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EpsRefine.h
# Opt level: O2

ostream * covenant::operator<<(ostream *o,GeneralizationMethod gen)

{
  string *this;
  char *pcVar1;
  allocator local_39;
  string local_38 [32];
  
  if (gen == GREEDY) {
    pcVar1 = "greedy";
  }
  else {
    if (gen != MAX_GEN) {
      this = (string *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string(local_38,"invalid generalization method",&local_39);
      std::__cxx11::string::string(this,local_38);
      __cxa_throw(this,&error::typeinfo,error::~error);
    }
    pcVar1 = "max-gen";
  }
  std::operator<<(o,pcVar1);
  return o;
}

Assistant:

std::ostream& operator<<(std::ostream& o, GeneralizationMethod gen)
{
    if (gen == GREEDY)
      o << "greedy";
    else if (gen == MAX_GEN)
      o << "max-gen";
    else 
      throw error("invalid generalization method");
    return o;
}